

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

dht_settings * __thiscall
libtorrent::aux::session_impl::get_dht_settings
          (dht_settings *__return_storage_ptr__,session_impl *this)

{
  mutex *pmVar1;
  byte bVar2;
  int iVar3;
  _WordT _Var4;
  unique_lock<std::mutex> local_40;
  
  __return_storage_ptr__->max_peers_reply = 100;
  __return_storage_ptr__->search_branching = 5;
  __return_storage_ptr__->max_fail_count = 0x14;
  __return_storage_ptr__->max_torrents = 2000;
  __return_storage_ptr__->max_dht_items = 700;
  __return_storage_ptr__->max_peers = 500;
  __return_storage_ptr__->max_torrent_search_reply = 0x14;
  __return_storage_ptr__->restrict_routing_ips = true;
  __return_storage_ptr__->restrict_search_ips = true;
  __return_storage_ptr__->extended_routing_table = true;
  __return_storage_ptr__->aggressive_lookups = true;
  __return_storage_ptr__->privacy_lookups = false;
  __return_storage_ptr__->enforce_node_id = false;
  __return_storage_ptr__->ignore_dark_internet = true;
  __return_storage_ptr__->block_timeout = 300;
  __return_storage_ptr__->block_ratelimit = 5;
  __return_storage_ptr__->read_only = false;
  __return_storage_ptr__->item_lifetime = 0;
  __return_storage_ptr__->upload_rate_limit = 8000;
  __return_storage_ptr__->sample_infohashes_interval = 0x5460;
  __return_storage_ptr__->max_infohashes_sample_count = 0x14;
  pmVar1 = &(this->m_settings).m_mutex;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x89];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->max_peers_reply = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x8a];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->search_branching = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x8b];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->max_fail_count = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x8c];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->max_torrents = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x8d];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->max_dht_items = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x8e];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->max_peers = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x8f];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->max_torrent_search_reply = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->restrict_routing_ips = (bool)((byte)_Var4 >> 6 & 1);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->restrict_search_ips = (bool)((byte)_Var4 >> 7);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  bVar2 = *(byte *)((long)(this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w + 9);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->extended_routing_table = (bool)(bVar2 & 1);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->aggressive_lookups = (bool)((byte)((uint)_Var4 >> 9) & 1);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->privacy_lookups = (bool)((byte)((uint)_Var4 >> 10) & 1);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->enforce_node_id = (bool)((byte)((uint)_Var4 >> 0xb) & 1);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->ignore_dark_internet = (bool)((byte)((uint)_Var4 >> 0xc) & 1);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x90];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->block_timeout = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x91];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->block_ratelimit = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var4 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[1];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->read_only = (bool)((byte)((uint)_Var4 >> 0xd) & 1);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x92];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->item_lifetime = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x52];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->upload_rate_limit = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x93];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->sample_infohashes_interval = iVar3;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar3 = (this->m_settings).m_store.m_ints._M_elems[0x94];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __return_storage_ptr__->max_infohashes_sample_count = iVar3;
  return __return_storage_ptr__;
}

Assistant:

dht::dht_settings session_impl::get_dht_settings() const
	{
		dht::dht_settings sett;
#define SET_BOOL(name) \
		sett.name = m_settings.get_bool( settings_pack::dht_ ## name )
#define SET_INT(name) \
		sett.name = m_settings.get_int( settings_pack::dht_ ## name )

		SET_INT(max_peers_reply);
		SET_INT(search_branching);
		SET_INT(max_fail_count);
		SET_INT(max_torrents);
		SET_INT(max_dht_items);
		SET_INT(max_peers);
		SET_INT(max_torrent_search_reply);
		SET_BOOL(restrict_routing_ips);
		SET_BOOL(restrict_search_ips);
		SET_BOOL(extended_routing_table);
		SET_BOOL(aggressive_lookups);
		SET_BOOL(privacy_lookups);
		SET_BOOL(enforce_node_id);
		SET_BOOL(ignore_dark_internet);
		SET_INT(block_timeout);
		SET_INT(block_ratelimit);
		SET_BOOL(read_only);
		SET_INT(item_lifetime);
		SET_INT(upload_rate_limit);
		SET_INT(sample_infohashes_interval);
		SET_INT(max_infohashes_sample_count);
#undef SET_BOOL
#undef SET_INT
		return sett;
	}